

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgettextcontrol.cpp
# Opt level: O3

void __thiscall
QWidgetTextControlPrivate::append(QWidgetTextControlPrivate *this,QString *text,TextFormat format)

{
  char cVar1;
  long in_FS_OFFSET;
  QAnyStringView QVar2;
  QTextCursor tmp;
  undefined1 local_60 [24];
  undefined1 *local_48;
  undefined1 *puStack_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_60._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QTextCursor::QTextCursor((QTextCursor *)local_60,this->doc);
  QTextCursor::beginEditBlock();
  QTextCursor::movePosition((MoveOperation)(QTextCursor *)local_60,0xb,0);
  cVar1 = QTextDocument::isEmpty();
  if (cVar1 == '\0') {
    QTextCursor::blockFormat();
    QTextCursor::charFormat();
    QTextCursor::insertBlock((QTextBlockFormat *)local_60,(QTextCharFormat *)&local_48);
    QTextFormat::~QTextFormat((QTextFormat *)(local_60 + 8));
  }
  else {
    QTextCursor::charFormat();
    QTextCursor::setCharFormat((QTextCharFormat *)local_60);
  }
  QTextFormat::~QTextFormat((QTextFormat *)&local_48);
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  QTextCursor::charFormat();
  if (format == RichText) {
LAB_004c8d1e:
    QTextCursor::insertHtml((QString *)local_60);
  }
  else {
    if (format == AutoText) {
      QVar2.m_size = (text->d).size | 0x8000000000000000;
      QVar2.field_0.m_data_utf16 = (text->d).ptr;
      cVar1 = Qt::mightBeRichText(QVar2);
      if (cVar1 != '\0') goto LAB_004c8d1e;
    }
    QTextCursor::insertText((QString *)local_60);
  }
  cVar1 = QTextCursor::hasSelection();
  if (cVar1 == '\0') {
    QTextCursor::setCharFormat((QTextCharFormat *)&this->cursor);
  }
  QTextCursor::endEditBlock();
  QTextFormat::~QTextFormat((QTextFormat *)&local_48);
  QTextCursor::~QTextCursor((QTextCursor *)local_60);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidgetTextControlPrivate::append(const QString &text, Qt::TextFormat format)
{
    QTextCursor tmp(doc);
    tmp.beginEditBlock();
    tmp.movePosition(QTextCursor::End);

    if (!doc->isEmpty())
        tmp.insertBlock(cursor.blockFormat(), cursor.charFormat());
    else
        tmp.setCharFormat(cursor.charFormat());

    // preserve the char format
    QTextCharFormat oldCharFormat = cursor.charFormat();

#ifndef QT_NO_TEXTHTMLPARSER
    if (format == Qt::RichText || (format == Qt::AutoText && Qt::mightBeRichText(text))) {
        tmp.insertHtml(text);
    } else {
        tmp.insertText(text);
    }
#else
    Q_UNUSED(format);
    tmp.insertText(text);
#endif // QT_NO_TEXTHTMLPARSER
    if (!cursor.hasSelection())
        cursor.setCharFormat(oldCharFormat);

    tmp.endEditBlock();
}